

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-cubic.c
# Opt level: O1

int cubic_on_switch(quicly_cc_t *cc)

{
  uint32_t uVar1;
  quicly_cc_type_t *pqVar2;
  int iVar3;
  
  pqVar2 = cc->type;
  iVar3 = 1;
  if ((pqVar2 != &quicly_cc_type_cubic) &&
     (iVar3 = 0, pqVar2 == &quicly_cc_type_reno || pqVar2 == &quicly_cc_type_pico)) {
    if (cc->cwnd_exiting_slow_start == 0) {
      cc->type = &quicly_cc_type_cubic;
    }
    else {
      uVar1 = cc->cwnd_initial;
      cc->type = (quicly_cc_type_t *)0x0;
      cc->cwnd = 0;
      cc->ssthresh = 0;
      cc->cwnd_minimum = 0;
      cc->cwnd_maximum = 0;
      *(undefined8 *)&cc->num_loss_episodes = 0;
      (cc->state).cubic.last_sent_time = 0;
      cc->cwnd_initial = 0;
      cc->cwnd_exiting_slow_start = 0;
      cc->recovery_end = 0;
      (cc->state).cubic.k = 0.0;
      *(undefined8 *)((long)&cc->state + 8) = 0;
      (cc->state).cubic.avoidance_start = 0;
      cc->type = &quicly_cc_type_cubic;
      cc->cwnd_maximum = uVar1;
      cc->cwnd_initial = uVar1;
      cc->cwnd = uVar1;
      cc->cwnd_minimum = 0xffffffff;
      cc->ssthresh = 0xffffffff;
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int cubic_on_switch(quicly_cc_t *cc)
{
    if (cc->type == &quicly_cc_type_cubic)
        return 1;

    if (cc->type == &quicly_cc_type_reno || cc->type == &quicly_cc_type_pico) {
        /* When in slow start, state can be reused as-is; otherwise, restart. */
        if (cc->cwnd_exiting_slow_start == 0) {
            cc->type = &quicly_cc_type_cubic;
        } else {
            cubic_reset(cc, cc->cwnd_initial);
        }
        return 1;
    }

    return 0;
}